

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_ApplyArgs
              (Var func,Var instance,void **stackPtr,CallInfo callInfo,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  RecyclableObject *this;
  JavascriptMethod entryPoint;
  undefined4 *puVar4;
  Var pvVar5;
  uint uVar6;
  Type TVar7;
  Arguments local_50;
  Var local_40;
  void **local_38;
  
  local_40 = instance;
  local_38 = stackPtr;
  bVar3 = JavascriptConversion::IsCallable(func);
  if (!bVar3) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
  }
  uVar6 = callInfo._0_4_ & 0xffffff;
  TVar7 = (Type)((ulong)callInfo & 0xffffffff00ffffff | 0x2000000);
  this = UnsafeVarTo<Js::RecyclableObject>(func);
  ThreadContext::ProbeStack
            (scriptContext->threadContext,(ulong)(uVar6 * 4 + 0xc00),scriptContext,(PVOID)0x0);
  entryPoint = RecyclableObject::GetEntryPoint(this);
  switch(uVar6) {
  case 0:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xde,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    goto LAB_00ab188d;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    break;
  case 6:
    break;
  case 7:
    break;
  default:
    local_50.Values = local_38 + -1;
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    local_50.Info = TVar7;
    pvVar5 = JavascriptFunction::CallFunction<false>(this,entryPoint,&local_50,false);
    pTVar1->reentrancySafeOrHandled = bVar3;
    return pvVar5;
  }
LAB_00ab188d:
  pvVar5 = (*entryPoint)(this,(CallInfo)this,TVar7,0,0,0,0,TVar7);
  return pvVar5;
}

Assistant:

Var JavascriptOperators::OP_ApplyArgs(Var func, Var instance, __in_xcount(8) void** stackPtr, CallInfo callInfo, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_OP_ApplyArgs);
        int argCount = callInfo.Count;
        ///
        /// Check func has internal [[Call]] property
        /// If not, throw TypeError
        ///
        if (!JavascriptConversion::IsCallable(func)) {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }

        // Fix callInfo: expect result/value, and none of other flags are currently applicable.
        //   OP_ApplyArgs expects a result. Neither of {jit, interpreted} mode sends correct callFlags:
        //   LdArgCnt -- jit sends whatever was passed to current function, interpreter always sends 0.
        //   See Win8 bug 490489.
        callInfo.Flags = CallFlags_Value;

        RecyclableObject *funcPtr = UnsafeVarTo<RecyclableObject>(func);
        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault + argCount * 4);

        JavascriptMethod entryPoint = funcPtr->GetEntryPoint();
        Var ret;

        switch (argCount) {
        case 0:
            Assert(false);
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo);
            break;
        case 1:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance);
            break;
        case 2:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0]);
            break;
        case 3:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1]);
            break;
        case 4:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1], stackPtr[2]);
            break;
        case 5:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1], stackPtr[2], stackPtr[3]);
            break;
        case 6:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1], stackPtr[2], stackPtr[3], stackPtr[4]);
            break;
        case 7:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1], stackPtr[2], stackPtr[3], stackPtr[4], stackPtr[5]);
            break;
        default:
        {
            // Don't need stack probe here- we just did so above
            Arguments args(callInfo, stackPtr - 1);
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                ret = JavascriptFunction::CallFunction<false>(funcPtr, entryPoint, args);
            }
            END_SAFE_REENTRANT_CALL
            break;
        }
        }
        return ret;
        JIT_HELPER_END(Op_OP_ApplyArgs);
    }